

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * operator+=(QString *a,
                    QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString_&>,_char>,_QString_&>
                    *b)

{
  ArrayOptions *pAVar1;
  QString *pQVar2;
  ulong uVar3;
  Data *pDVar4;
  long lVar5;
  ulong uVar6;
  char16_t *pcVar7;
  long lVar8;
  ulong uVar9;
  char16_t *pcVar10;
  
  pDVar4 = (a->d).d;
  uVar6 = (a->d).size;
  uVar9 = (b->b->d).size + (b->a).a.a.d.size + uVar6 + (((b->a).a.b)->d).size + 1;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)uVar6);
    pDVar4 = (a->d).d;
    uVar6 = (a->d).size;
    uVar3 = uVar9;
    if (pDVar4 != (Data *)0x0) goto LAB_00261e36;
LAB_00261e7e:
    if (uVar3 < uVar6) {
      uVar3 = uVar6;
    }
    QString::reallocData((longlong)a,(AllocationOption)uVar3);
    pDVar4 = (a->d).d;
    if (pDVar4 != (Data *)0x0) {
      lVar5 = (pDVar4->super_QArrayData).alloc;
LAB_00261ea1:
      if (lVar5 != 0) {
        pAVar1 = &(pDVar4->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      goto LAB_00261eaa;
    }
  }
  else {
LAB_00261e36:
    lVar5 = (pDVar4->super_QArrayData).alloc;
    lVar8 = (long)((long)(a->d).ptr -
                  ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1
    ;
    if ((long)((lVar5 - uVar6) - lVar8) < (long)uVar9) {
      uVar3 = lVar5 * 2;
      if (lVar5 * 2 < (long)uVar9) {
        uVar3 = uVar9;
      }
      if ((1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar5 - lVar8 <= (long)uVar3)) goto LAB_00261e7e;
      goto LAB_00261ea1;
    }
LAB_00261eaa:
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_00261ec2;
  }
  QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_00261ec2:
  pcVar10 = (a->d).ptr + (a->d).size;
  lVar5 = (b->a).a.a.d.size;
  if (lVar5 != 0) {
    pcVar7 = (b->a).a.a.d.ptr;
    if (pcVar7 == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar10,pcVar7,lVar5 * 2);
  }
  pcVar10 = pcVar10 + lVar5;
  pQVar2 = (b->a).a.b;
  lVar5 = (pQVar2->d).size;
  if (lVar5 != 0) {
    pcVar7 = (pQVar2->d).ptr;
    if (pcVar7 == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar10,pcVar7,lVar5 * 2);
  }
  pcVar10[lVar5] = (ushort)(byte)(b->a).b;
  lVar8 = (b->b->d).size;
  if (lVar8 != 0) {
    pcVar7 = (b->b->d).ptr;
    if (pcVar7 == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar10 + lVar5 + 1,pcVar7,lVar8 * 2);
  }
  QString::resize((longlong)a);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}